

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  ostream *poVar10;
  char *pcVar11;
  SDL_Window *window;
  long lVar12;
  undefined8 uVar13;
  MovieState *pMVar14;
  nanoseconds nVar15;
  uint8_t *puVar16;
  long lVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  Uint32 i;
  ulong uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  _Var26;
  pointer __p;
  bool bVar27;
  double dVar28;
  double dVar29;
  int *in_stack_fffffffffffffe88;
  double local_150;
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  movState;
  int argc_local;
  int pitch;
  int pict_linesize [3];
  uint8_t *pict_data [3];
  uint8_t *local_100;
  char **argv_local;
  undefined8 *local_e8;
  void *pixels;
  long local_d8;
  long local_d0;
  SDL_RendererInfo rinf;
  string local_70;
  string local_50;
  
  movState._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
          )0x0;
  argc_local = argc;
  argv_local = argv;
  if (argc < 2) {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar10 = std::operator<<(poVar10,*argv_local);
    poVar10 = std::operator<<(poVar10," [-device <device name>] [-direct] <files...>");
  }
  else {
    avformat_network_init();
    iVar9 = SDL_Init(0x4020);
    if (iVar9 == 0) {
      window = (SDL_Window *)
               SDL_CreateWindow((anonymous_namespace)::AppName_abi_cxx11_,0,0,0x280,0x1e0,0x20);
      if (window == (SDL_Window *)0x0) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"SDL: could not set video mode - exiting");
        std::endl<char,std::char_traits<char>>(poVar10);
        goto LAB_00105b3c;
      }
      lVar12 = SDL_CreateRenderer(window,0xffffffffffffffff,6);
      if (lVar12 == 0) {
LAB_00105c51:
        lVar12 = SDL_CreateRenderer(window,0xffffffffffffffff,5);
        if (lVar12 != 0) goto LAB_00105c67;
        pcVar11 = "SDL: could not create renderer - exiting";
      }
      else {
        rinf.texture_formats[0xc] = 0;
        rinf.texture_formats[0xd] = 0;
        rinf.texture_formats[0xe] = 0;
        rinf.texture_formats[0xf] = 0;
        rinf.texture_formats[8] = 0;
        rinf.texture_formats[9] = 0;
        rinf.texture_formats[10] = 0;
        rinf.texture_formats[0xb] = 0;
        rinf.texture_formats[4] = 0;
        rinf.texture_formats[5] = 0;
        rinf.texture_formats[6] = 0;
        rinf.texture_formats[7] = 0;
        rinf.texture_formats[0] = 0;
        rinf.texture_formats[1] = 0;
        rinf.texture_formats[2] = 0;
        rinf.texture_formats[3] = 0;
        rinf.name = (char *)0x0;
        rinf.flags = 0;
        rinf.num_texture_formats = 0;
        rinf.max_texture_width = 0;
        rinf.max_texture_height = 0;
        iVar9 = SDL_GetRendererInfo(lVar12);
        if (iVar9 != 0) {
LAB_00105c1e:
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "IYUV pixelformat textures not supported on renderer ");
          poVar10 = std::operator<<(poVar10,rinf.name);
          std::endl<char,std::char_traits<char>>(poVar10);
          SDL_DestroyRenderer(lVar12);
          goto LAB_00105c51;
        }
        bVar27 = false;
        for (uVar21 = 0; (!bVar27 && (uVar21 < (ulong)rinf._8_8_ >> 0x20)); uVar21 = uVar21 + 1) {
          bVar27 = rinf.texture_formats[uVar21] == 0x56555949;
        }
        if (!bVar27) goto LAB_00105c1e;
LAB_00105c67:
        SDL_SetRenderDrawColor(lVar12,0,0,0,0xff);
        SDL_RenderFillRect(lVar12,0);
        SDL_RenderPresent(lVar12);
        argv_local = argv_local + 1;
        argc_local = argc_local + -1;
        iVar9 = InitAL(&argv_local,&argc_local);
        if (iVar9 == 0) {
          uVar13 = alcGetCurrentContext();
          uVar13 = alcGetContextsDevice(uVar13);
          cVar8 = alcIsExtensionPresent(uVar13,"ALC_SOFT_device_clock");
          if (cVar8 != '\0') {
            poVar10 = std::operator<<((ostream *)&std::cout,"Found ALC_SOFT_device_clock");
            std::endl<char,std::char_traits<char>>(poVar10);
            (anonymous_namespace)::alcGetInteger64vSOFT =
                 alcGetProcAddress(uVar13,"alcGetInteger64vSOFT");
          }
          cVar8 = alIsExtensionPresent("AL_SOFT_source_latency");
          if (cVar8 != '\0') {
            poVar10 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_source_latency");
            std::endl<char,std::char_traits<char>>(poVar10);
            (anonymous_namespace)::alGetSourcei64vSOFT = alGetProcAddress("alGetSourcei64vSOFT");
          }
          cVar8 = alIsExtensionPresent("AL_SOFT_events");
          if (cVar8 != '\0') {
            poVar10 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_events");
            std::endl<char,std::char_traits<char>>(poVar10);
            (anonymous_namespace)::alEventControlSOFT = alGetProcAddress("alEventControlSOFT");
            (anonymous_namespace)::alEventCallbackSOFT = alGetProcAddress("alEventCallbackSOFT");
          }
          cVar8 = alIsExtensionPresent("AL_SOFTX_callback_buffer");
          if (cVar8 != '\0') {
            poVar10 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_callback_buffer");
            std::endl<char,std::char_traits<char>>(poVar10);
            (anonymous_namespace)::alBufferCallbackSOFT = alGetProcAddress("alBufferCallbackSOFT");
          }
          for (lVar23 = 0; uVar21 = (ulong)argc_local, lVar23 < (long)uVar21; lVar23 = lVar23 + 1) {
            pcVar11 = argv_local[lVar23];
            iVar9 = strcmp(pcVar11,"-direct");
            if (iVar9 == 0) {
              cVar8 = alIsExtensionPresent("AL_SOFT_direct_channels_remix");
              if (cVar8 == '\0') {
                cVar8 = alIsExtensionPresent("AL_SOFT_direct_channels");
                pcVar11 = "AL_SOFT_direct_channels not supported for direct output";
                if (cVar8 == '\0') goto LAB_00105f16;
                poVar10 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_direct_channels");
                std::endl<char,std::char_traits<char>>(poVar10);
                (anonymous_namespace)::DirectOutMode = 1;
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cout,
                                          "Found AL_SOFT_direct_channels_remix");
                std::endl<char,std::char_traits<char>>(poVar10);
                (anonymous_namespace)::DirectOutMode = 2;
              }
            }
            else {
              iVar9 = strcmp(pcVar11,"-wide");
              if (iVar9 == 0) {
                cVar8 = alIsExtensionPresent("AL_EXT_STEREO_ANGLES");
                pcVar11 = "AL_EXT_STEREO_ANGLES not supported for wide stereo";
                if (cVar8 == '\0') {
LAB_00105f16:
                  poVar10 = std::operator<<((ostream *)&std::cerr,pcVar11);
                  std::endl<char,std::char_traits<char>>(poVar10);
                }
                else {
                  poVar10 = std::operator<<((ostream *)&std::cout,"Found AL_EXT_STEREO_ANGLES");
                  std::endl<char,std::char_traits<char>>(poVar10);
                  (anonymous_namespace)::EnableWideStereo = 1;
                }
              }
              else {
                iVar9 = strcmp(pcVar11,"-novideo");
                if (iVar9 != 0) break;
                (anonymous_namespace)::DisableVideo = 1;
              }
            }
          }
          do {
            if ((int)uVar21 <= lVar23) goto LAB_00105fe7;
            if ((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                 )movState._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                 )0x0) goto LAB_00105ff0;
            pMVar14 = (MovieState *)operator_new(0x5c0);
            std::__cxx11::string::string
                      ((string *)&local_70,argv_local[lVar23],(allocator *)pict_data);
            anon_unknown.dwarf_e668::MovieState::MovieState(pMVar14,&local_70);
            rinf.name = (char *)0x0;
            std::
            __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
            ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                     *)&movState,pMVar14);
            std::
            unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                           *)&rinf);
            std::__cxx11::string::~string((string *)&local_70);
            bVar27 = anon_unknown.dwarf_e668::MovieState::prepare
                               ((MovieState *)
                                movState._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                                _M_head_impl);
            if (!bVar27) {
              std::
              __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                       *)&movState,(pointer)0x0);
            }
            uVar21 = (ulong)(uint)argc_local;
            lVar23 = lVar23 + 1;
          } while( true );
        }
        pcVar11 = "Failed to set up audio device";
      }
      poVar10 = std::operator<<((ostream *)&std::cerr,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar10);
      goto LAB_00105b3c;
    }
    poVar10 = std::operator<<((ostream *)&std::cerr,"Could not initialize SDL - <<");
    pcVar11 = (char *)SDL_GetError();
    poVar10 = std::operator<<(poVar10,pcVar11);
  }
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_00105b3c:
  std::
  unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
  ::~unique_ptr(&movState);
  return 1;
LAB_00105fe7:
  if ((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
       )movState._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
        .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
       )0x0) {
LAB_00105ff0:
    anon_unknown.dwarf_e668::MovieState::setTitle
              ((MovieState *)
               movState._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
               .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl,
               window);
    bVar27 = false;
    local_100 = (uint8_t *)0x8000000000000000;
    do {
      rinf.texture_formats[4] = 0;
      rinf.texture_formats[5] = 0;
      rinf.texture_formats[6] = 0;
      rinf.texture_formats[7] = 0;
      rinf.texture_formats[0] = 0;
      rinf.texture_formats[1] = 0;
      rinf.texture_formats[2] = 0;
      rinf.texture_formats[3] = 0;
      rinf.name = (char *)0x0;
      rinf.flags = 0;
      rinf.num_texture_formats = 0;
      rinf.texture_formats[8] = 0;
      rinf.texture_formats[9] = 0;
      iVar9 = SDL_WaitEventTimeout(&rinf,10);
      _Var26._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
      .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
            )(tuple<(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
              )movState;
      nVar15 = anon_unknown.dwarf_e668::MovieState::getMasterClock
                         ((MovieState *)
                          movState._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl);
      puVar16 = (uint8_t *)(nVar15.__r / 1000000000);
      if (puVar16 != local_100) {
        lVar17 = *(long *)(*(long *)((long)_Var26._M_t.
                                           super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                           .
                                           super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                           ._M_head_impl + 8) + 0x448);
        poVar10 = std::operator<<((ostream *)&std::cout,"    \r ");
        pict_data[0] = puVar16;
        anon_unknown.dwarf_e668::operator<<(poVar10,(PrettyTime *)pict_data);
        poVar10 = std::operator<<(poVar10," / ");
        pict_linesize._0_8_ = lVar17 / 1000000;
        anon_unknown.dwarf_e668::operator<<(poVar10,(PrettyTime *)pict_linesize);
        std::ostream::flush();
        local_100 = puVar16;
      }
      if (iVar9 == 0) {
        bVar3 = false;
      }
      else {
        bVar3 = false;
        do {
          if ((int)rinf.name == 0x100) {
LAB_00106157:
            LOCK();
            *(undefined1 *)
             ((long)_Var26._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl
             + 0x20) = 1;
            UNLOCK();
            bVar27 = true;
          }
          else if ((int)rinf.name == 0x200) {
            if ((char)rinf.num_texture_formats == '\x03') {
              bVar3 = true;
            }
            else if ((char)rinf.num_texture_formats == '\x05') {
              SDL_SetRenderDrawColor(lVar12,0,0,0,0xff);
              bVar3 = true;
              SDL_RenderFillRect(lVar12);
            }
          }
          else if ((int)rinf.name == 0x8000) {
            std::operator<<((ostream *)&std::cout,'\n');
            if (bVar27) {
LAB_001068cc:
              std::
              __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                       *)&movState,(pointer)0x0);
              CloseAL();
              SDL_DestroyRenderer(lVar12);
              SDL_DestroyWindow();
              SDL_Quit();
              exit(0);
            }
            std::
            __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
            ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                     *)&movState,(pointer)0x0);
            for (lVar23 = (long)(int)lVar23;
                _Var26._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl =
                     (tuple<(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      )(tuple<(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                        )movState._M_t.
                         super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                         _M_head_impl, lVar23 < argc_local; lVar23 = lVar23 + 1) {
              if ((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                   )movState._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl
                  != (__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      )0x0) goto LAB_00106273;
              pMVar14 = (MovieState *)operator_new(0x5c0);
              std::__cxx11::string::string
                        ((string *)&local_50,argv_local[lVar23],(allocator *)pict_linesize);
              anon_unknown.dwarf_e668::MovieState::MovieState(pMVar14,&local_50);
              pict_data[0] = (uint8_t *)0x0;
              std::
              __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                       *)&movState,pMVar14);
              std::
              unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
              ::~unique_ptr((unique_ptr<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                             *)pict_data);
              std::__cxx11::string::~string((string *)&local_50);
              bVar27 = anon_unknown.dwarf_e668::MovieState::prepare
                                 ((MovieState *)
                                  movState._M_t.
                                  super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                  ._M_head_impl);
              if (!bVar27) {
                std::
                __uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                ::reset((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         *)&movState,(pointer)0x0);
              }
            }
            if ((__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                 )movState._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                 )0x0) goto LAB_001068cc;
LAB_00106273:
            anon_unknown.dwarf_e668::MovieState::setTitle
                      ((MovieState *)
                       movState._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::MovieState,_std::default_delete<(anonymous_namespace)::MovieState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                       _M_head_impl,window);
            bVar27 = false;
            local_100 = (uint8_t *)0x8000000000000000;
          }
          else if ((int)rinf.name == 0x300) {
            if (rinf.texture_formats[1] == 0x6e) {
              LOCK();
              *(undefined1 *)
               ((long)_Var26._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                      _M_head_impl + 0x20) = 1;
              UNLOCK();
              bVar27 = false;
            }
            else if (rinf.texture_formats[1] == 0x1b) goto LAB_00106157;
          }
          iVar9 = SDL_PollEvent(&rinf);
        } while (iVar9 != 0);
      }
      uVar21 = *(ulong *)((long)_Var26._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                                _M_head_impl + 0x508);
      nVar15 = anon_unknown.dwarf_e668::MovieState::getMasterClock
                         (*(MovieState **)
                           ((long)_Var26._M_t.
                                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                  ._M_head_impl + 0x278));
      lVar17 = uVar21 << 4;
      bVar7 = false;
      do {
        bVar5 = bVar7;
        uVar20 = uVar21;
        plVar18 = (long *)(lVar17 + (long)_Var26._M_t.
                                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                          .
                                          super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                          ._M_head_impl + 0x388);
        uVar21 = (uVar20 + 1) % 0x18;
        if (uVar21 == *(ulong *)((long)_Var26._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                       ._M_head_impl + 0x510)) break;
        lVar17 = uVar21 * 0x10;
        bVar7 = true;
      } while (*(long *)((long)_Var26._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                               .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                               _M_head_impl + 0x390 + lVar17) <= nVar15.__r);
      if ((*(byte *)(*(long *)((long)_Var26._M_t.
                                     super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                     .
                                     super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                     ._M_head_impl + 0x278) + 0x20) & 1) != 0) {
        if ((*(byte *)((long)_Var26._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                             .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                             _M_head_impl + 0x581) & 1) != 0) {
          LOCK();
          *(undefined1 *)
           ((long)_Var26._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl +
           0x582) = 1;
          UNLOCK();
        }
        *(ulong *)((long)_Var26._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                         _M_head_impl + 0x508) = uVar20;
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)pict_data,
                   (mutex_type *)
                   ((long)_Var26._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl + 0x518));
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)pict_data);
        goto LAB_0010637d;
      }
      if (bVar5) {
        *(ulong *)((long)_Var26._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                         _M_head_impl + 0x508) = uVar20;
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)pict_data,
                   (mutex_type *)
                   ((long)_Var26._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl + 0x518));
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)pict_data);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)pict_data);
        std::condition_variable::notify_one();
        if (*(long *)((long)_Var26._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                            _M_head_impl + 0x570) == 0) {
LAB_00106429:
          lVar17 = SDL_CreateTexture(lVar12,0x56555949,1,
                                     *(undefined4 *)
                                      (*(long *)((long)_Var26._M_t.
                                                                                                              
                                                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                                  .
                                                  super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                                  ._M_head_impl + 0x288) + 0x7c),
                                     *(undefined4 *)
                                      (*(long *)((long)_Var26._M_t.
                                                                                                              
                                                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                                  .
                                                  super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                                  ._M_head_impl + 0x288) + 0x80));
          *(long *)((long)_Var26._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl + 0x570) = lVar17;
          if (lVar17 == 0) {
            poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to create YV12 texture!");
            std::endl<char,std::char_traits<char>>(poVar10);
          }
          lVar17 = *(long *)((long)_Var26._M_t.
                                   super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                   .
                                   super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                   ._M_head_impl + 0x288);
          iVar9 = *(int *)(lVar17 + 0x74);
          *(int *)((long)_Var26._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                         _M_head_impl + 0x578) = iVar9;
          iVar22 = *(int *)(lVar17 + 0x78);
          *(int *)((long)_Var26._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                         _M_head_impl + 0x57c) = iVar22;
          bVar4 = 1;
          if ((0 < iVar22 &
              0 < iVar9 &
              *(byte *)((long)_Var26._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                              .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                              _M_head_impl + 0x580)) == 1) {
            *(undefined1 *)
             ((long)_Var26._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl
             + 0x580) = 0;
            if (*(int *)(lVar17 + 0xec) != 0) {
              dVar28 = (double)(int)*(undefined8 *)(lVar17 + 0xe8) /
                       (double)(int)((ulong)*(undefined8 *)(lVar17 + 0xe8) >> 0x20);
              if (1.0 <= dVar28) {
                iVar9 = (int)((double)iVar9 * dVar28 + 0.5);
              }
              else if (0.0 < dVar28) {
                iVar22 = (int)((double)iVar22 / dVar28 + 0.5);
              }
            }
            SDL_SetWindowSize(window,iVar9,iVar22);
            bVar4 = 1;
          }
        }
        else {
          if ((*(int *)((long)_Var26._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                              .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                              _M_head_impl + 0x578) !=
               *(int *)(*(long *)((long)_Var26._M_t.
                                        super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                        .
                                        super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                        ._M_head_impl + 0x288) + 0x74)) ||
             (*(int *)((long)_Var26._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                             .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                             _M_head_impl + 0x57c) !=
              *(int *)(*(long *)((long)_Var26._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                       ._M_head_impl + 0x288) + 0x78))) {
            SDL_DestroyTexture();
            goto LAB_00106429;
          }
          bVar4 = 0;
        }
        lVar17 = *(long *)((long)_Var26._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                 .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                                 _M_head_impl + 0x570);
        if (lVar17 != 0) {
          puVar2 = (undefined8 *)*plVar18;
          pixels = (void *)0x0;
          pitch = 0;
          if (*(int *)(*(long *)((long)_Var26._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                       ._M_head_impl + 0x288) + 0x88) == 0) {
            in_stack_fffffffffffffe88 = (int *)puVar2[2];
            SDL_UpdateYUVTexture
                      (lVar17,0,*puVar2,*(undefined4 *)(puVar2 + 8),puVar2[1],
                       *(undefined4 *)((long)puVar2 + 0x44),in_stack_fffffffffffffe88,
                       *(undefined4 *)(puVar2 + 9));
          }
          else {
            local_e8 = puVar2;
            iVar9 = SDL_LockTexture(lVar17,0,&pixels,&pitch);
            if (iVar9 == 0) {
              lVar17 = *(long *)((long)_Var26._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                       ._M_head_impl + 0x288);
              lVar19 = *(long *)((long)_Var26._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                       ._M_head_impl + 0x380);
              local_d8 = (long)*(int *)(lVar17 + 0x7c);
              local_d0 = (long)*(int *)(lVar17 + 0x80);
              uVar1 = *(undefined4 *)(lVar17 + 0x78);
              if (!(bool)(~bVar4 & lVar19 != 0)) {
                lVar19 = sws_getContext(*(undefined4 *)(lVar17 + 0x74),uVar1,
                                        *(undefined4 *)(lVar17 + 0x88),
                                        *(undefined4 *)(lVar17 + 0x74),uVar1,0,
                                        (ulong)in_stack_fffffffffffffe88 & 0xffffffff00000000,0,0,0)
                ;
                lVar17 = *(long *)((long)_Var26._M_t.
                                         super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                         .
                                         super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                         ._M_head_impl + 0x380);
                *(long *)((long)_Var26._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                                _M_head_impl + 0x380) = lVar19;
                if (lVar17 != 0) {
                  sws_freeContext();
                  lVar19 = *(long *)((long)_Var26._M_t.
                                           super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                           .
                                           super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                           ._M_head_impl + 0x380);
                }
              }
              pict_data[0] = (uint8_t *)pixels;
              uVar20 = local_d0 * local_d8;
              pict_data[1] = (uint8_t *)(uVar20 + (long)pixels);
              pict_data[2] = pict_data[1] +
                             (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                         uVar20 & 0xffffffff) / 4);
              pict_linesize[2] = pitch / 2;
              pict_linesize[1] = pict_linesize[2];
              pict_linesize[0] = pitch;
              in_stack_fffffffffffffe88 = pict_linesize;
              sws_scale(lVar19,local_e8,local_e8 + 8,0,uVar1,pict_data,in_stack_fffffffffffffe88);
              SDL_UnlockTexture(*(undefined8 *)
                                 ((long)_Var26._M_t.
                                        super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                        .
                                        super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                        ._M_head_impl + 0x570));
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to lock texture");
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
        }
LAB_001066d2:
        if (*(long *)((long)_Var26._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                            _M_head_impl + 0x570) != 0) {
          lVar17 = *(long *)((long)_Var26._M_t.
                                   super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                   .
                                   super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                   ._M_head_impl + 0x288);
          if (*(int *)(lVar17 + 0xe8) == 0) {
            dVar28 = (double)(int)*(undefined8 *)(lVar17 + 0x74);
            dVar29 = (double)(int)((ulong)*(undefined8 *)(lVar17 + 0x74) >> 0x20);
LAB_00106733:
            local_150 = dVar28 / dVar29;
          }
          else {
            dVar28 = (double)(int)*(undefined8 *)(lVar17 + 0x74);
            dVar29 = (double)(int)((ulong)*(undefined8 *)(lVar17 + 0x74) >> 0x20);
            local_150 = (((double)(int)*(undefined8 *)(lVar17 + 0xe8) /
                         (double)(int)((ulong)*(undefined8 *)(lVar17 + 0xe8) >> 0x20)) * dVar28) /
                        dVar29;
            if (local_150 <= 0.0) goto LAB_00106733;
          }
          SDL_GetWindowSize(window,&pixels,&pitch);
          local_e8 = (undefined8 *)CONCAT44(local_e8._4_4_,pitch);
          dVar28 = rint((double)pitch * local_150);
          uVar25 = (int)dVar28 + 3U & 0xfffffffc;
          uVar6 = (uint)pixels;
          uVar24 = (uint)local_e8;
          if ((int)(uint)pixels < (int)uVar25) {
            dVar28 = rint((double)(int)(uint)pixels / local_150);
            uVar24 = (int)dVar28 + 3U & 0xfffffffc;
            uVar25 = uVar6;
          }
          pict_data[0] = (uint8_t *)0x0;
          pict_data[1] = *(uint8_t **)
                          ((long)_Var26._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                 .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                                 _M_head_impl + 0x578);
          pict_linesize[1] = (int)((uint)local_e8 - uVar24) / 2;
          pict_linesize[0] = (int)(uVar6 - uVar25) / 2;
          pict_linesize[2] = uVar25;
          SDL_RenderCopy(lVar12,*(undefined8 *)
                                 ((long)_Var26._M_t.
                                        super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                        .
                                        super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                        ._M_head_impl + 0x570),pict_data,pict_linesize);
          SDL_RenderPresent(lVar12);
        }
        if (bVar5) {
          uVar13 = av_gettime();
          std::mutex::lock((mutex *)&((pthread_mutex_t *)
                                     ((long)_Var26._M_t.
                                            super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                            .
                                            super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                            ._M_head_impl + 0x358))->__data);
          *(long *)((long)_Var26._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl + 0x348) = plVar18[1];
          *(undefined8 *)
           ((long)_Var26._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl +
           0x350) = uVar13;
          pthread_mutex_unlock
                    ((pthread_mutex_t *)
                     ((long)_Var26._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                            _M_head_impl + 0x358));
        }
      }
      else if (bVar3) goto LAB_001066d2;
      if (((*(byte *)((long)_Var26._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                            _M_head_impl + 0x581) & 1) != 0) &&
         (uVar21 == *(ulong *)((long)_Var26._M_t.
                                     super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                                     .
                                     super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>
                                     ._M_head_impl + 0x510))) {
        LOCK();
        *(undefined1 *)
         ((long)_Var26._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>._M_head_impl +
         0x582) = 1;
        UNLOCK();
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)pict_data,
                   (mutex_type *)
                   ((long)_Var26._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::MovieState_*,_std::default_delete<(anonymous_namespace)::MovieState>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::MovieState_*,_false>.
                          _M_head_impl + 0x518));
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)pict_data);
LAB_0010637d:
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)pict_data);
        std::condition_variable::notify_one();
      }
    } while( true );
  }
  poVar10 = std::operator<<((ostream *)&std::cerr,"Could not start a video");
  std::endl<char,std::char_traits<char>>(poVar10);
  goto LAB_00105b3c;
}

Assistant:

int main(int argc, char *argv[])
{
    std::unique_ptr<MovieState> movState;

    if(argc < 2)
    {
        std::cerr<< "Usage: "<<argv[0]<<" [-device <device name>] [-direct] <files...>" <<std::endl;
        return 1;
    }
    /* Register all formats and codecs */
#if !(LIBAVFORMAT_VERSION_INT >= AV_VERSION_INT(58, 9, 100))
    av_register_all();
#endif
    /* Initialize networking protocols */
    avformat_network_init();

    if(SDL_Init(SDL_INIT_VIDEO | SDL_INIT_EVENTS))
    {
        std::cerr<< "Could not initialize SDL - <<"<<SDL_GetError() <<std::endl;
        return 1;
    }

    /* Make a window to put our video */
    SDL_Window *screen{SDL_CreateWindow(AppName.c_str(), 0, 0, 640, 480, SDL_WINDOW_RESIZABLE)};
    if(!screen)
    {
        std::cerr<< "SDL: could not set video mode - exiting" <<std::endl;
        return 1;
    }
    /* Make a renderer to handle the texture image surface and rendering. */
    Uint32 render_flags{SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC};
    SDL_Renderer *renderer{SDL_CreateRenderer(screen, -1, render_flags)};
    if(renderer)
    {
        SDL_RendererInfo rinf{};
        bool ok{false};

        /* Make sure the renderer supports IYUV textures. If not, fallback to a
         * software renderer. */
        if(SDL_GetRendererInfo(renderer, &rinf) == 0)
        {
            for(Uint32 i{0u};!ok && i < rinf.num_texture_formats;i++)
                ok = (rinf.texture_formats[i] == SDL_PIXELFORMAT_IYUV);
        }
        if(!ok)
        {
            std::cerr<< "IYUV pixelformat textures not supported on renderer "<<rinf.name <<std::endl;
            SDL_DestroyRenderer(renderer);
            renderer = nullptr;
        }
    }
    if(!renderer)
    {
        render_flags = SDL_RENDERER_SOFTWARE | SDL_RENDERER_PRESENTVSYNC;
        renderer = SDL_CreateRenderer(screen, -1, render_flags);
    }
    if(!renderer)
    {
        std::cerr<< "SDL: could not create renderer - exiting" <<std::endl;
        return 1;
    }
    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
    SDL_RenderFillRect(renderer, nullptr);
    SDL_RenderPresent(renderer);

    /* Open an audio device */
    ++argv; --argc;
    if(InitAL(&argv, &argc))
    {
        std::cerr<< "Failed to set up audio device" <<std::endl;
        return 1;
    }

    {
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        if(alcIsExtensionPresent(device, "ALC_SOFT_device_clock"))
        {
            std::cout<< "Found ALC_SOFT_device_clock" <<std::endl;
            alcGetInteger64vSOFT = reinterpret_cast<LPALCGETINTEGER64VSOFT>(
                alcGetProcAddress(device, "alcGetInteger64vSOFT")
            );
        }
    }

    if(alIsExtensionPresent("AL_SOFT_source_latency"))
    {
        std::cout<< "Found AL_SOFT_source_latency" <<std::endl;
        alGetSourcei64vSOFT = reinterpret_cast<LPALGETSOURCEI64VSOFT>(
            alGetProcAddress("alGetSourcei64vSOFT")
        );
    }
#ifdef AL_SOFT_events
    if(alIsExtensionPresent("AL_SOFT_events"))
    {
        std::cout<< "Found AL_SOFT_events" <<std::endl;
        alEventControlSOFT = reinterpret_cast<LPALEVENTCONTROLSOFT>(
            alGetProcAddress("alEventControlSOFT"));
        alEventCallbackSOFT = reinterpret_cast<LPALEVENTCALLBACKSOFT>(
            alGetProcAddress("alEventCallbackSOFT"));
    }
#endif
#ifdef AL_SOFT_callback_buffer
    if(alIsExtensionPresent("AL_SOFTX_callback_buffer"))
    {
        std::cout<< "Found AL_SOFT_callback_buffer" <<std::endl;
        alBufferCallbackSOFT = reinterpret_cast<LPALBUFFERCALLBACKSOFT>(
            alGetProcAddress("alBufferCallbackSOFT"));
    }
#endif

    int fileidx{0};
    for(;fileidx < argc;++fileidx)
    {
        if(strcmp(argv[fileidx], "-direct") == 0)
        {
            if(alIsExtensionPresent("AL_SOFT_direct_channels_remix"))
            {
                std::cout<< "Found AL_SOFT_direct_channels_remix" <<std::endl;
                DirectOutMode = AL_REMIX_UNMATCHED_SOFT;
            }
            else if(alIsExtensionPresent("AL_SOFT_direct_channels"))
            {
                std::cout<< "Found AL_SOFT_direct_channels" <<std::endl;
                DirectOutMode = AL_DROP_UNMATCHED_SOFT;
            }
            else
                std::cerr<< "AL_SOFT_direct_channels not supported for direct output" <<std::endl;
        }
        else if(strcmp(argv[fileidx], "-wide") == 0)
        {
            if(!alIsExtensionPresent("AL_EXT_STEREO_ANGLES"))
                std::cerr<< "AL_EXT_STEREO_ANGLES not supported for wide stereo" <<std::endl;
            else
            {
                std::cout<< "Found AL_EXT_STEREO_ANGLES" <<std::endl;
                EnableWideStereo = true;
            }
        }
        else if(strcmp(argv[fileidx], "-novideo") == 0)
            DisableVideo = true;
        else
            break;
    }

    while(fileidx < argc && !movState)
    {
        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
        if(!movState->prepare()) movState = nullptr;
    }
    if(!movState)
    {
        std::cerr<< "Could not start a video" <<std::endl;
        return 1;
    }
    movState->setTitle(screen);

    /* Default to going to the next movie at the end of one. */
    enum class EomAction {
        Next, Quit
    } eom_action{EomAction::Next};
    seconds last_time{seconds::min()};
    while(1)
    {
        SDL_Event event{};
        int have_evt{SDL_WaitEventTimeout(&event, 10)};

        auto cur_time = std::chrono::duration_cast<seconds>(movState->getMasterClock());
        if(cur_time != last_time)
        {
            auto end_time = std::chrono::duration_cast<seconds>(movState->getDuration());
            std::cout<< "    \r "<<PrettyTime{cur_time}<<" / "<<PrettyTime{end_time} <<std::flush;
            last_time = cur_time;
        }

        bool force_redraw{false};
        if(have_evt) do {
            switch(event.type)
            {
            case SDL_KEYDOWN:
                switch(event.key.keysym.sym)
                {
                case SDLK_ESCAPE:
                    movState->mQuit = true;
                    eom_action = EomAction::Quit;
                    break;

                case SDLK_n:
                    movState->mQuit = true;
                    eom_action = EomAction::Next;
                    break;

                default:
                    break;
                }
                break;

            case SDL_WINDOWEVENT:
                switch(event.window.event)
                {
                case SDL_WINDOWEVENT_RESIZED:
                    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
                    SDL_RenderFillRect(renderer, nullptr);
                    force_redraw = true;
                    break;

                case SDL_WINDOWEVENT_EXPOSED:
                    force_redraw = true;
                    break;

                default:
                    break;
                }
                break;

            case SDL_QUIT:
                movState->mQuit = true;
                eom_action = EomAction::Quit;
                break;

            case FF_MOVIE_DONE_EVENT:
                std::cout<<'\n';
                last_time = seconds::min();
                if(eom_action != EomAction::Quit)
                {
                    movState = nullptr;
                    while(fileidx < argc && !movState)
                    {
                        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
                        if(!movState->prepare()) movState = nullptr;
                    }
                    if(movState)
                    {
                        movState->setTitle(screen);
                        break;
                    }
                }

                /* Nothing more to play. Shut everything down and quit. */
                movState = nullptr;

                CloseAL();

                SDL_DestroyRenderer(renderer);
                renderer = nullptr;
                SDL_DestroyWindow(screen);
                screen = nullptr;

                SDL_Quit();
                exit(0);

            default:
                break;
            }
        } while(SDL_PollEvent(&event));

        movState->mVideo.updateVideo(screen, renderer, force_redraw);
    }

    std::cerr<< "SDL_WaitEvent error - "<<SDL_GetError() <<std::endl;
    return 1;
}